

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_in_out_testing_v2.cpp
# Opt level: O2

bool problem_with_file_to_read(ifstream *in_file,string *in_name)

{
  byte bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  bVar1 = std::__basic_file<char>::is_open();
  if (bVar1 == 0) {
    std::operator+(&local_38,"\n!! Problems reading from in_file \'",in_name);
    std::operator+(&bStack_58,&local_38,"\'. Aborting!\n");
    write_colored_text(&bStack_58,red);
    std::__cxx11::string::~string((string *)&bStack_58);
    std::__cxx11::string::~string((string *)&local_38);
  }
  return (bool)(bVar1 ^ 1);
}

Assistant:

bool problem_with_file_to_read(ifstream &in_file, const string &in_name) {
    if (!in_file.is_open()) {
        write_colored_text("\n!! Problems reading from in_file '" + in_name + "'. Aborting!\n");
        return true;  // NOTE: closing of already opened files is not necessary, as they are closed when ifstream/ofstream are destroyed
    }
    return false;
}